

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pow.cpp
# Opt level: O0

bool CheckProofOfWorkImpl(uint256 hash,uint nBits,Params *params)

{
  long lVar1;
  bool bVar2;
  bool *in_RSI;
  long in_FS_OFFSET;
  bool fOverflow;
  bool fNegative;
  arith_uint256 bnTarget;
  arith_uint256 *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  base_uint<256U> *a;
  uint7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  bool bVar3;
  uint in_stack_ffffffffffffff94;
  arith_uint256 *in_stack_ffffffffffffff98;
  
  a = (base_uint<256U> *)&stack0x00000008;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  arith_uint256::arith_uint256(in_stack_ffffffffffffff68);
  arith_uint256::SetCompact
            (in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,in_RSI,
             (bool *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
  bVar3 = true;
  if ((in_stack_ffffffffffffff94 & 0x1000000) == 0) {
    bVar2 = operator==(a,CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
    bVar3 = true;
    if ((!bVar2) && (bVar3 = true, (in_stack_ffffffffffffff94 & 0x10000) == 0)) {
      UintToArith256((uint256 *)CONCAT17(1,in_stack_ffffffffffffff80));
      bVar3 = operator>(a,(base_uint<256U> *)
                          CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
    }
  }
  if (bVar3 == false) {
    UintToArith256((uint256 *)(ulong)in_stack_ffffffffffffff80);
    bVar3 = operator>(a,(base_uint<256U> *)
                        CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
    if (bVar3) {
      bVar3 = false;
    }
    else {
      bVar3 = true;
    }
  }
  else {
    bVar3 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool CheckProofOfWorkImpl(uint256 hash, unsigned int nBits, const Consensus::Params& params)
{
    bool fNegative;
    bool fOverflow;
    arith_uint256 bnTarget;

    bnTarget.SetCompact(nBits, &fNegative, &fOverflow);

    // Check range
    if (fNegative || bnTarget == 0 || fOverflow || bnTarget > UintToArith256(params.powLimit))
        return false;

    // Check proof of work matches claimed amount
    if (UintToArith256(hash) > bnTarget)
        return false;

    return true;
}